

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[4],int,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*arg) [4],int *args,char (*args_1) [2])

{
  string sStack_58;
  string local_38;
  
  StringBuilder_abi_cxx11_(&local_38,*arg);
  StringBuilder<int,char_const(&)[2]>(&sStack_58,args,args_1);
  std::operator+(__return_storage_ptr__,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}